

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9ResourceULT.cpp
# Opt level: O3

void __thiscall
CTestGen9Resource_TestCubeTileYResource_Test::TestBody
          (CTestGen9Resource_TestCubeTileYResource_Test *this)

{
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *psVar1;
  bool bVar2;
  byte bVar3;
  ulong uVar4;
  GMM_RESOURCE_INFO *pGVar5;
  int iVar6;
  char *pcVar7;
  uint uVar8;
  uint uVar9;
  uint32_t CubeFaceIndex;
  uint uVar10;
  uint uVar11;
  undefined4 local_168;
  undefined4 local_164;
  undefined8 local_160;
  undefined8 local_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  ulong uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  ulong local_e8;
  ulong local_e0;
  undefined8 uStack_d8;
  GMM_REQ_OFFSET_INFO OffsetInfo;
  TEST_BPP bpp;
  AssertHelper local_50;
  internal local_48 [8];
  AssertionResult gtest_ar;
  
  uStack_f8 = 0;
  local_110 = 0;
  uStack_108 = 0;
  local_120 = 0;
  uStack_118 = 0;
  uStack_128 = 0;
  local_140 = 0;
  local_150 = 0;
  uStack_148 = 0;
  local_f0 = 0;
  local_168 = 4;
  local_100 = 0x100000000;
  local_158 = 0x1000000000;
  local_160 = 0x400000000;
  uVar4 = 0;
  psVar1 = &gtest_ar.message_;
  do {
    local_164 = (&DAT_001a6610)[uVar4];
    uStack_138 = 1;
    local_130 = 0x100000001;
    pGVar5 = (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&local_168);
    CTestResource::VerifyResourceHAlign<true>((CTestResource *)this,pGVar5,0x10);
    CTestResource::VerifyResourceVAlign<true>((CTestResource *)this,pGVar5,4);
    CTestResource::VerifyResourcePitch<true>((CTestResource *)this,pGVar5,0x80);
    CTestResource::VerifyResourcePitchInTiles<true>((CTestResource *)this,pGVar5,1);
    CTestResource::VerifyResourceSize<true>((CTestResource *)this,pGVar5,0x1000);
    CTestResource::VerifyResourceQPitch<true>((CTestResource *)this,pGVar5,4);
    iVar6 = 0;
    uVar10 = 0;
    do {
      OffsetInfo._0_4_ = 0;
      OffsetInfo.ArrayIndex = 0;
      OffsetInfo.CubeFace = __GMM_CUBE_FACE_POS_X;
      OffsetInfo.Plane = GMM_NO_PLANE;
      OffsetInfo.StdLayout.Offset = 0;
      OffsetInfo.StdLayout.TileRowPitch = 0;
      OffsetInfo.Render.XOffset = 0;
      OffsetInfo.Render.YOffset = 0;
      OffsetInfo.Render.ZOffset = 0;
      OffsetInfo.Render._20_4_ = 0;
      OffsetInfo.Lock.Pitch = 0;
      OffsetInfo.Lock.field_2 =
           (anon_union_4_2_7f1cee3a_for_anon_struct_16_3_bc420dd9_for_Lock_3)0x0;
      OffsetInfo.Render.field_0.Offset64 = 0;
      OffsetInfo.Frame = GMM_DISPLAY_BASE;
      OffsetInfo._28_4_ = 0;
      OffsetInfo.Lock.field_0.Offset64 = 0;
      uStack_d8 = 1;
      OffsetInfo.Slice = 0;
      OffsetInfo.MipLevel = uVar10;
      (**(code **)(*(long *)pGVar5 + 0x68))(pGVar5,&uStack_d8);
      gtest_ar.message_.ptr_._0_4_ = 0;
      testing::internal::CmpHelperEQ<int,unsigned_long>
                (local_48,"0","OffsetInfo.Render.Offset64",(int *)psVar1,
                 (unsigned_long *)&OffsetInfo.Lock.Pitch);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)psVar1);
        pcVar7 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar7 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0xc1b,pcVar7);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)psVar1);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if (CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) != 0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) !=
              (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_
                                          ) + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      gtest_ar.message_.ptr_._0_4_ = 0;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                (local_48,"0","OffsetInfo.Render.XOffset",(int *)psVar1,(uint *)&OffsetInfo.Render);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)psVar1);
        pcVar7 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar7 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0xc1c,pcVar7);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)psVar1);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if (CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) != 0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) !=
              (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_
                                          ) + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      gtest_ar.message_.ptr_._0_4_ = iVar6;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                (local_48,"CubeFaceIndex * VAlign","OffsetInfo.Render.YOffset",(uint *)psVar1,
                 (uint *)((long)&OffsetInfo.Render.field_0 + 4));
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)psVar1);
        pcVar7 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar7 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0xc1d,pcVar7);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)psVar1);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if (CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) != 0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) !=
              (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_
                                          ) + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      gtest_ar.message_.ptr_._0_4_ = 0;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                (local_48,"0","OffsetInfo.Render.ZOffset",(int *)psVar1,&OffsetInfo.Render.XOffset);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)psVar1);
        pcVar7 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar7 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0xc1e,pcVar7);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)psVar1);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if (CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) != 0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) !=
              (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_
                                          ) + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      uVar10 = uVar10 + 1;
      iVar6 = iVar6 + 4;
    } while (uVar10 != 6);
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGVar5);
    uVar10 = (int)uVar4 + 1;
    uVar4 = (ulong)uVar10;
  } while (uVar10 != 4);
  local_e0 = 0;
  psVar1 = &gtest_ar.message_;
  do {
    local_164 = (&DAT_001a7ffc)[local_e0];
    bVar3 = (char)(0x80 / (byte)(0x1008040201 >> ((char)local_e0 * '\b' & 0x3fU))) + 1;
    uStack_138 = (ulong)bVar3;
    local_130 = CONCAT44(1,(uint)bVar3);
    pGVar5 = (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&local_168);
    CTestResource::VerifyResourceHAlign<true>((CTestResource *)this,pGVar5,0x10);
    CTestResource::VerifyResourceVAlign<true>((CTestResource *)this,pGVar5,4);
    CTestResource::VerifyResourcePitch<true>((CTestResource *)this,pGVar5,0x100);
    CTestResource::VerifyResourcePitchInTiles<true>((CTestResource *)this,pGVar5,2);
    uVar8 = (int)local_130 + 3U & 0xfffffffc;
    CTestResource::VerifyResourceQPitch<true>((CTestResource *)this,pGVar5,(ulong)uVar8);
    CTestResource::VerifyResourceSize<true>
              ((CTestResource *)this,pGVar5,(ulong)(uVar8 * 0x600 + 0x1f00 & 0xffffe000));
    uVar10 = 0;
    uVar11 = 0;
    uVar9 = 0;
    local_e8 = (ulong)uVar8;
    do {
      OffsetInfo._0_4_ = 0;
      OffsetInfo.ArrayIndex = 0;
      OffsetInfo.CubeFace = __GMM_CUBE_FACE_POS_X;
      OffsetInfo.Plane = GMM_NO_PLANE;
      OffsetInfo.StdLayout.Offset = 0;
      OffsetInfo.StdLayout.TileRowPitch = 0;
      OffsetInfo.Render.XOffset = 0;
      OffsetInfo.Render.YOffset = 0;
      OffsetInfo.Render.ZOffset = 0;
      OffsetInfo.Render._20_4_ = 0;
      OffsetInfo.Lock.Pitch = 0;
      OffsetInfo.Lock.field_2 =
           (anon_union_4_2_7f1cee3a_for_anon_struct_16_3_bc420dd9_for_Lock_3)0x0;
      OffsetInfo.Render.field_0.Offset64 = 0;
      OffsetInfo.Frame = GMM_DISPLAY_BASE;
      OffsetInfo._28_4_ = 0;
      OffsetInfo.Lock.field_0.Offset64 = 0;
      uStack_d8 = 1;
      OffsetInfo.Slice = 0;
      OffsetInfo.MipLevel = uVar9;
      (**(code **)(*(long *)pGVar5 + 0x68))(pGVar5,&uStack_d8);
      gtest_ar.message_.ptr_._0_4_ = uVar10 & 0xffffe000;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                (local_48,
                 "((CubeFaceIndex * ExpectedQPitch) - ((CubeFaceIndex * ExpectedQPitch) & ((TileSize[0][1]) - 1))) * ExpectedPitch"
                 ,"OffsetInfo.Render.Offset64",(uint *)psVar1,
                 (unsigned_long *)&OffsetInfo.Lock.Pitch);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)psVar1);
        pcVar7 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar7 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0xc48,pcVar7);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)psVar1);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if (CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) != 0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) !=
              (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_
                                          ) + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      gtest_ar.message_.ptr_._0_4_ = 0;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                (local_48,"0","OffsetInfo.Render.XOffset",(int *)psVar1,(uint *)&OffsetInfo.Render);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)psVar1);
        pcVar7 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar7 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0xc49,pcVar7);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)psVar1);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if (CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) != 0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) !=
              (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_
                                          ) + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      gtest_ar.message_.ptr_._0_4_ = uVar11 & 0x1c;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                (local_48,"(CubeFaceIndex * ExpectedQPitch) % TileSize[0][1]",
                 "OffsetInfo.Render.YOffset",(uint *)psVar1,
                 (uint *)((long)&OffsetInfo.Render.field_0 + 4));
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)psVar1);
        pcVar7 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar7 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0xc4b,pcVar7);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)psVar1);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if (CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) != 0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) !=
              (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_
                                          ) + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      gtest_ar.message_.ptr_._0_4_ = 0;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                (local_48,"0","OffsetInfo.Render.ZOffset",(int *)psVar1,&OffsetInfo.Render.XOffset);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)psVar1);
        pcVar7 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar7 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0xc4c,pcVar7);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)psVar1);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if (CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) != 0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) !=
              (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_
                                          ) + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      uVar9 = uVar9 + 1;
      uVar11 = uVar11 + (int)local_e8;
      uVar10 = uVar10 + uVar8 * 0x100;
    } while (uVar9 != 6);
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGVar5);
    uVar10 = (int)local_e0 + 1;
    local_e0 = (ulong)uVar10;
  } while (uVar10 != 5);
  return;
}

Assistant:

TEST_F(CTestGen9Resource, TestCubeTileYResource)
{
    // Cube is allocated as an array of 6 2D surface representing each cube face below
    //===============================
    // �q� coordinate  |    face    |
    //      0          |    + x     |
    //      1          |    - x     |
    //      2          |    + y     |
    //      3          |    - y     |
    //      4          |    + z     |
    //      5          |    - z     |
    //===============================

    const uint32_t HAlign = 16;
    const uint32_t VAlign = 4;

    const uint32_t TileSize[1][2] = {128, 32};

    GMM_RESCREATE_PARAMS gmmParams = {};
    gmmParams.Type                 = RESOURCE_CUBE;
    gmmParams.NoGfxMemory          = 1;
    gmmParams.Flags.Info.TiledY    = 1;
    gmmParams.Flags.Gpu.Texture    = 1;

    // Allocate 1x1 surface within a tile.
    for(uint32_t i = 0; i < TEST_BPP_128; i++) //TEST_BPP_128 cannot fit in a tile as HAlign = 16
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = 0x1;
        gmmParams.BaseHeight  = 0x1;
        gmmParams.Depth       = 0x1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign);
        VerifyResourcePitch<true>(ResourceInfo, TileSize[0][0]); // As wide as 1 tile
        VerifyResourcePitchInTiles<true>(ResourceInfo, 1);       // 1 tile wide
        VerifyResourceSize<true>(ResourceInfo, GMM_KBYTE(4));    // All 6 faces should be accomated in a tile.
        VerifyResourceQPitch<true>(ResourceInfo, VAlign);        // Each face should be VAlign rows apart within a tile

        for(uint32_t CubeFaceIndex = 0; CubeFaceIndex < __GMM_MAX_CUBE_FACE; CubeFaceIndex++)
        {
            GMM_REQ_OFFSET_INFO OffsetInfo = {};
            OffsetInfo.ReqRender           = 1;
            OffsetInfo.CubeFace            = static_cast<GMM_CUBE_FACE_ENUM>(CubeFaceIndex);
            ResourceInfo->GetOffset(OffsetInfo);
            EXPECT_EQ(0, OffsetInfo.Render.Offset64);                     // Render offset should be 0 as its on single tile.
            EXPECT_EQ(0, OffsetInfo.Render.XOffset);                      // X Offset should be 0
            EXPECT_EQ(CubeFaceIndex * VAlign, OffsetInfo.Render.YOffset); // Y Offset should be VALIGN * CubeFace Index
            EXPECT_EQ(0, OffsetInfo.Render.ZOffset);
        }

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }

    // Allocate 2 tiles in X dimension.
    // Width and Height of Cube must be equal
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = (TileSize[0][0] / GetBppValue(bpp)) + 1; // 1 pixel larger than 1 tile width
        gmmParams.BaseHeight  = gmmParams.BaseWidth64;                   // Heigth must be equal to width.
        gmmParams.Depth       = 0x1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign);

        uint32_t ExpectedPitch = TileSize[0][0] * 2; // As wide as 2 tile
        VerifyResourcePitch<true>(ResourceInfo, ExpectedPitch);
        VerifyResourcePitchInTiles<true>(ResourceInfo, 2); // 2 tile wide

        uint32_t ExpectedQPitch = GMM_ULT_ALIGN(gmmParams.BaseHeight, VAlign);
        VerifyResourceQPitch<true>(ResourceInfo, ExpectedQPitch); // Each face should be Valigned-BaseHeight rows apart

        VerifyResourceSize<true>(ResourceInfo, // PitchInBytes * Rows where Rows = __GMM_MAX_CUBE_FACE x QPitch, then aligned to tile boundary
                                 ExpectedPitch *
                                 GMM_ULT_ALIGN(__GMM_MAX_CUBE_FACE * ExpectedQPitch,
                                               TileSize[0][1]));


        for(uint32_t CubeFaceIndex = 0; CubeFaceIndex < __GMM_MAX_CUBE_FACE; CubeFaceIndex++)
        {
            GMM_REQ_OFFSET_INFO OffsetInfo = {};
            OffsetInfo.ReqRender           = 1;
            OffsetInfo.CubeFace            = static_cast<GMM_CUBE_FACE_ENUM>(CubeFaceIndex);
            ResourceInfo->GetOffset(OffsetInfo);
            EXPECT_EQ(GMM_ULT_ALIGN_FLOOR(CubeFaceIndex * ExpectedQPitch, TileSize[0][1]) * ExpectedPitch,
                      OffsetInfo.Render.Offset64);   // Render offset is tile's base address on which cube face begins.
            EXPECT_EQ(0, OffsetInfo.Render.XOffset); // X Offset should be 0
            EXPECT_EQ((CubeFaceIndex * ExpectedQPitch) % TileSize[0][1],
                      OffsetInfo.Render.YOffset);    // Y Offset should be (CubeFaceIndex * QPitch) % TileHeight
            EXPECT_EQ(0, OffsetInfo.Render.ZOffset); // Z offset N/A should be 0
        }

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }
}